

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodePositions(ObjEncoder *this)

{
  bool bVar1;
  AttributeValueIndex att_id;
  PointAttribute *this_00;
  size_t sVar2;
  ObjEncoder *in_RDI;
  AttributeValueIndex i;
  array<float,_3UL> value;
  PointAttribute *att;
  undefined4 in_stack_ffffffffffffffb8;
  Type in_stack_ffffffffffffffbc;
  PointCloud *in_stack_ffffffffffffffc0;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> in_stack_ffffffffffffffd8;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> IVar3;
  undefined4 in_stack_ffffffffffffffdc;
  void *in_stack_ffffffffffffffe0;
  PointAttribute *this_01;
  
  this_00 = PointCloud::GetNamedAttribute(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if ((this_00 != (PointAttribute *)0x0) && (sVar2 = PointAttribute::size(this_00), sVar2 != 0)) {
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType
              ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
               &stack0xffffffffffffffd8,0);
    while( true ) {
      sVar2 = PointAttribute::size(this_00);
      att_id.value_ = (uint)sVar2;
      bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                        ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                         &stack0xffffffffffffffd8,(uint *)&stack0xffffffffffffffd4);
      if (!bVar1) {
        in_RDI->pos_att_ = this_00;
        return true;
      }
      IVar3.value_ = in_stack_ffffffffffffffd8.value_;
      this_01 = this_00;
      std::array<float,_3UL>::operator[]
                ((array<float,_3UL> *)this_00,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      bVar1 = GeometryAttribute::ConvertValue<float,3>
                        ((GeometryAttribute *)in_RDI,att_id,(float *)this_00);
      if (!bVar1) break;
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)this_01,in_stack_ffffffffffffffe0,
                 CONCAT44(in_stack_ffffffffffffffdc,IVar3.value_));
      std::array<float,_3UL>::operator[]
                ((array<float,_3UL> *)this_00,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      EncodeFloatList((ObjEncoder *)CONCAT44(att_id.value_,in_stack_ffffffffffffffd8.value_),
                      (float *)in_RDI,(int)((ulong)this_00 >> 0x20));
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)this_01,in_stack_ffffffffffffffe0,
                 CONCAT44(in_stack_ffffffffffffffdc,IVar3.value_));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 &stack0xffffffffffffffd8);
      in_stack_ffffffffffffffd8.value_ = IVar3.value_;
      this_00 = this_01;
    }
    return false;
  }
  return false;
}

Assistant:

bool ObjEncoder::EncodePositions() {
  const PointAttribute *const att =
      in_point_cloud_->GetNamedAttribute(GeometryAttribute::POSITION);
  if (att == nullptr || att->size() == 0) {
    return false;  // Position attribute must be valid.
  }
  std::array<float, 3> value;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(att->size()); ++i) {
    if (!att->ConvertValue<float, 3>(i, &value[0])) {
      return false;
    }
    buffer()->Encode("v ", 2);
    EncodeFloatList(&value[0], 3);
    buffer()->Encode("\n", 1);
  }
  pos_att_ = att;
  return true;
}